

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

int sys_trim(mstate m,size_t pad)

{
  int iVar1;
  msegmentptr ss;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  size_t sVar5;
  char *new_br;
  char *rel_br;
  char *old_br;
  size_t newsize;
  msegmentptr sp;
  size_t extra;
  size_t unit;
  size_t released;
  size_t pad_local;
  mstate m_local;
  
  unit = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  sVar5 = mparams.granularity;
  if ((pad < 0xffffffffffffff80) && (m->top != (mchunkptr)0x0)) {
    if (pad + 0x50 < m->topsize) {
      sp = (msegmentptr)
           ((((m->topsize - (pad + 0x50)) + (mparams.granularity - 1)) / mparams.granularity - 1) *
           mparams.granularity);
      ss = segment_holding(m,(char *)m->top);
      iVar1 = malloc_global_mutex;
      if ((ss->sflags & 8) == 0) {
        if ((ss->sflags & 1) == 0) {
          if ((msegmentptr)0x7ffffffffffffffe < sp) {
            sp = (msegmentptr)(-0x8000000000000000 - sVar5);
          }
          LOCK();
          malloc_global_mutex = 1;
          UNLOCK();
          if (iVar1 != 0) {
            spin_acquire_lock(&malloc_global_mutex);
          }
          pcVar2 = (char *)sbrk(0);
          if (pcVar2 == ss->base + ss->size) {
            pvVar3 = sbrk(-(long)sp);
            pcVar4 = (char *)sbrk(0);
            if ((pvVar3 != (void *)0xffffffffffffffff) && (pcVar4 < pcVar2)) {
              unit = (long)pcVar2 - (long)pcVar4;
            }
          }
          malloc_global_mutex = 0;
        }
        else if (((sp <= (msegmentptr)ss->size) && (iVar1 = has_segment_link(m,ss), iVar1 == 0)) &&
                (iVar1 = munmap(ss->base + (ss->size - (long)sp),(size_t)sp), iVar1 == 0)) {
          unit = (size_t)sp;
        }
      }
      if (unit != 0) {
        ss->size = ss->size - unit;
        m->footprint = m->footprint - unit;
        init_top(m,m->top,m->topsize - unit);
      }
    }
    sVar5 = release_unused_segments(m);
    unit = sVar5 + unit;
    if ((unit == 0) && (m->trim_check < m->topsize)) {
      m->trim_check = 0xffffffffffffffff;
    }
  }
  return (uint)(unit != 0);
}

Assistant:

static int sys_trim(mstate m, size_t pad) {
  size_t released = 0;
  ensure_initialization();
  if (pad < MAX_REQUEST && is_initialized(m)) {
    pad += TOP_FOOT_SIZE; /* ensure enough room for segment overhead */

    if (m->topsize > pad) {
      /* Shrink top space in granularity-size units, keeping at least one */
      size_t unit = mparams.granularity;
      size_t extra = ((m->topsize - pad + (unit - SIZE_T_ONE)) / unit -
                      SIZE_T_ONE) * unit;
      msegmentptr sp = segment_holding(m, (char*)m->top);

      if (!is_extern_segment(sp)) {
        if (is_mmapped_segment(sp)) {
          if (HAVE_MMAP &&
              sp->size >= extra &&
              !has_segment_link(m, sp)) { /* can't shrink if pinned */
            size_t newsize = sp->size - extra;
            (void)newsize; /* placate people compiling -Wunused-variable */
            /* Prefer mremap, fall back to munmap */
            if ((CALL_MREMAP(sp->base, sp->size, newsize, 0) != MFAIL) ||
                (CALL_MUNMAP(sp->base + newsize, extra) == 0)) {
              released = extra;
            }
          }
        }
        else if (HAVE_MORECORE) {
          if (extra >= HALF_MAX_SIZE_T) /* Avoid wrapping negative */
            extra = (HALF_MAX_SIZE_T) + SIZE_T_ONE - unit;
          ACQUIRE_MALLOC_GLOBAL_LOCK();
          {
            /* Make sure end of memory is where we last set it. */
            char* old_br = (char*)(CALL_MORECORE(0));
            if (old_br == sp->base + sp->size) {
              char* rel_br = (char*)(CALL_MORECORE(-extra));
              char* new_br = (char*)(CALL_MORECORE(0));
              if (rel_br != CMFAIL && new_br < old_br)
                released = old_br - new_br;
            }
          }
          RELEASE_MALLOC_GLOBAL_LOCK();
        }
      }

      if (released != 0) {
        sp->size -= released;
        m->footprint -= released;
        init_top(m, m->top, m->topsize - released);
        check_top_chunk(m, m->top);
      }
    }

    /* Unmap any unused mmapped segments */
    if (HAVE_MMAP)
      released += release_unused_segments(m);

    /* On failure, disable autotrim to avoid repeated failed future calls */
    if (released == 0 && m->topsize > m->trim_check)
      m->trim_check = MAX_SIZE_T;
  }

  return (released != 0)? 1 : 0;
}